

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_exaone::llm_build_exaone
          (llm_build_exaone *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  undefined8 uVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *v_mla;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  const_reference pvVar7;
  ggml_tensor *pgVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ggml_tensor *pgVar11;
  llm_graph_context *this_00;
  ggml_tensor *pgVar12;
  ggml_tensor *pgVar13;
  ggml_tensor *pgVar14;
  pointer plVar15;
  size_t in_RCX;
  long in_RSI;
  ggml_tensor *in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *rope_factors;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffd88;
  int iVar16;
  llm_graph_context *in_stack_fffffffffffffd90;
  ggml_tensor *in_stack_fffffffffffffd98;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffda0;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffda8;
  undefined4 uVar17;
  llm_graph_context *in_stack_fffffffffffffdb0;
  ggml_tensor *in_stack_fffffffffffffde0;
  ggml_tensor *in_stack_fffffffffffffde8;
  llm_graph_context *in_stack_fffffffffffffdf0;
  ggml_tensor *in_stack_fffffffffffffe28;
  ggml_tensor *in_stack_fffffffffffffe30;
  ggml_tensor *in_stack_fffffffffffffe48;
  ggml_tensor *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_fffffffffffffe58;
  ggml_tensor *pgVar18;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  size_t sVar19;
  ggml_tensor *in_stack_fffffffffffffe98;
  llm_graph_context *in_stack_fffffffffffffea0;
  ggml_tensor *in_stack_ffffffffffffff60;
  ggml_tensor *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff98;
  int iVar20;
  int iVar21;
  ggml_tensor *local_48;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffda0,
             (llm_graph_params *)in_stack_fffffffffffffd98);
  uVar1 = *(uint *)(in_RDI->buffer + 0x24);
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x2be9,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x14)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x2bea,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_rot");
  }
  pgVar3 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  pgVar14 = pgVar3;
  v_mla = llm_graph_context::build_inp_pos(in_stack_fffffffffffffdf0);
  pgVar4 = (ggml_tensor *)
           llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffe30);
  for (iVar20 = 0; (long)iVar20 < in_RDI->ne[3]; iVar20 = iVar20 + 1) {
    pgVar18 = pgVar14;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar20);
    iVar21 = (int)pgVar18;
    llm_graph_context::build_norm
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd98,(llm_norm_type)((ulong)in_stack_fffffffffffffd90 >> 0x20),
               (int)in_stack_fffffffffffffd90);
    uVar17 = (undefined4)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    pgVar5 = std::function<ggml_tensor_*(unsigned_int,_int)>::operator()
                       ((function<ggml_tensor_*(unsigned_int,_int)> *)in_stack_fffffffffffffd90,
                        (uint)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                        (ggml_type)in_stack_fffffffffffffd88);
    iVar16 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar20);
    pgVar6 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        in_stack_fffffffffffffde0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar16);
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar20);
    pgVar18 = pgVar4;
    if (pvVar7->bq != (ggml_tensor *)0x0) {
      pgVar18 = in_RDI->src[5];
      pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar20);
      pgVar6 = (ggml_tensor *)ggml_add(pgVar18,pgVar6,pvVar7->bq);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (char *)in_stack_fffffffffffffd90,iVar16);
      pgVar18 = pgVar4;
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar20);
    pgVar4 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        in_stack_fffffffffffffde0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar16);
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar20);
    if (pvVar7->bk != (ggml_tensor *)0x0) {
      pgVar8 = in_RDI->src[5];
      pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar20);
      pgVar4 = (ggml_tensor *)ggml_add(pgVar8,pgVar4,pvVar7->bk);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (char *)in_stack_fffffffffffffd90,iVar16);
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar20);
    pgVar8 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        in_stack_fffffffffffffde0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar16);
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar20);
    if (pvVar7->bv != (ggml_tensor *)0x0) {
      pgVar11 = in_RDI->src[5];
      pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar20);
      pgVar8 = (ggml_tensor *)ggml_add(pgVar11,pgVar8,pvVar7->bv);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (char *)in_stack_fffffffffffffd90,iVar16);
    }
    uVar9 = ggml_reshape_3d(in_RDI->src[5],pgVar6,uVar1,in_RDI->nb[3],
                            (long)*(int *)(in_RDI->src + 2));
    uVar10._0_4_ = in_RDI->op;
    uVar10._4_4_ = in_RDI->op_params[0];
    uVar10 = ggml_reshape_3d(in_RDI->src[5],pgVar4,uVar1,uVar10,(long)*(int *)(in_RDI->src + 2));
    uVar2._0_4_ = in_RDI->op;
    uVar2._4_4_ = in_RDI->op_params[0];
    pgVar11 = (ggml_tensor *)
              ggml_reshape_3d(in_RDI->src[5],pgVar8,uVar1,uVar2,(long)*(int *)(in_RDI->src + 2));
    this_00 = (llm_graph_context *)
              ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],
                            in_RDI->flags,*(undefined4 *)in_RDI->src,
                            *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],uVar9,v_mla,pgVar5
                            ,(int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    pgVar12 = (ggml_tensor *)
              ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],
                            in_RDI->flags,*(undefined4 *)in_RDI->src,
                            *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],uVar10,v_mla,
                            pgVar5,(int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar16);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar16);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar16);
    sVar19 = in_RCX;
    pgVar4 = pgVar18;
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar20);
    type_gate = (llm_ffn_gate_type)sVar19;
    type_op = (llm_ffn_op_type)pgVar18;
    iVar16 = (int)pvVar7->wo;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar20);
    pgVar6 = pgVar11;
    pgVar8 = pgVar12;
    sqrtf((float)uVar1);
    pgVar13 = (ggml_tensor *)CONCAT44(uVar17,iVar20);
    mw = (ggml_tensor *)0x0;
    cur_00 = (ggml_tensor *)0x0;
    pgVar18 = pgVar11;
    pgVar5 = pgVar12;
    local_48 = llm_graph_context::build_attn
                         (this_00,(llm_graph_input_attn_kv_unified *)pgVar8,(ggml_cgraph *)pgVar6,
                          in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_RDI,pgVar14,
                          (ggml_tensor *)CONCAT44(iVar20,in_stack_ffffffffffffff98),pgVar4,v_mla,
                          (float)((ulong)pgVar3 >> 0x20),iVar21);
    iVar21 = (int)((ulong)pgVar12 >> 0x20);
    if ((long)iVar20 == in_RDI->ne[3] + -1) {
      in_stack_fffffffffffffe58 =
           llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffde0);
      in_stack_ffffffffffffff68 = in_stack_fffffffffffffe58;
      local_48 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_48,in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe50 = local_48;
      in_stack_fffffffffffffe48 =
           (ggml_tensor *)ggml_get_rows(in_RDI->src[5],pgVar14,in_stack_ffffffffffffff68);
      pgVar14 = in_stack_fffffffffffffe48;
    }
    pgVar12 = (ggml_tensor *)ggml_add(in_RDI->src[5],local_48,pgVar14);
    pgVar8 = pgVar12;
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)pgVar11,iVar21);
    in_stack_ffffffffffffff60 = pgVar8;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar20);
    pgVar13 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffdb0,pgVar13,mw,cur_00,
                         (llm_norm_type)((ulong)pgVar11 >> 0x20),(int)pgVar11);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)pgVar11,iVar21);
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar20);
    pgVar14 = pvVar7->ffn_up;
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar20);
    pgVar6 = pvVar7->ffn_gate;
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar20);
    in_stack_fffffffffffffd98 = pvVar7->ffn_down;
    in_stack_fffffffffffffdb0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffda8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffda0 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffd90 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffd88 = (ggml_tensor *)0x0;
    pgVar14 = llm_graph_context::build_ffn
                        ((llm_graph_context *)pgVar8,in_stack_fffffffffffffe28,
                         (ggml_tensor *)&stack0xfffffffffffffd88,pgVar6,pgVar14,pgVar13,pgVar12,
                         in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,
                         in_stack_fffffffffffffe58,pgVar18,pgVar5,type_op,type_gate,iVar16);
    in_stack_fffffffffffffe28 = pgVar14;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    ggml_add(in_RDI->src[5],pgVar14,in_stack_ffffffffffffff60);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    pgVar14 = llm_graph_context::build_cvec(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
  }
  pgVar4 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                      in_stack_fffffffffffffd98,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                      (int)in_stack_fffffffffffffd90);
  iVar20 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  pgVar14 = pgVar4;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (char *)in_stack_fffffffffffffd90,iVar20);
  plVar15 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4f777b);
  plVar15->t_embd = pgVar4;
  pgVar14 = llm_graph_context::build_lora_mm
                      ((llm_graph_context *)pgVar14,in_stack_fffffffffffffde8,pgVar4);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (char *)in_stack_fffffffffffffd90,iVar20);
  plVar15 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4f7800);
  plVar15->t_logits = pgVar14;
  ggml_build_forward_expand(in_RCX,pgVar14);
  return;
}

Assistant:

llm_build_exaone(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // rope freq factors for llama3; may return nullptr for llama2 and other models
                ggml_tensor * rope_factors = static_cast<const llama_kv_cache_unified *>(memory)->cbs.get_rope_factors(n_ctx_per_seq, il);

                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, rope_factors,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, rope_factors,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   NULL, NULL,
                    model.layers[il].ffn_gate, NULL, NULL,
                    model.layers[il].ffn_down, NULL, NULL,
                    NULL,
                    LLM_FFN_SILU, LLM_FFN_PAR, il);
            cb(cur, "ffn_out", il);

            cur = ggml_add(ctx0, cur, ffn_inp);
            cb(cur, "ffn_out", il);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }